

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::PathTypeHandlerWithAttr::PathTypeHandlerWithAttr
          (PathTypeHandlerWithAttr *this,TypePath *typePath,ObjectSlotAttributes *attributes,
          PathTypeSetterSlotIndex *setters,PathTypeSetterSlotIndex setterCount,uint16 pathLength,
          PropertyIndex slotCapacity,uint16 inlineSlotCapacity,uint16 offsetOfInlineSlots,
          bool isLocked,bool isShared,DynamicType *predecessorType)

{
  PathTypeHandlerNoAttr::PathTypeHandlerNoAttr
            (&this->super_PathTypeHandlerNoAttr,typePath,pathLength,slotCapacity,inlineSlotCapacity,
             offsetOfInlineSlots,isLocked,isShared,predecessorType);
  (this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
  _vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_013d92b0;
  Memory::WriteBarrierPtr<Js::ObjectSlotAttributes>::WriteBarrierSet(&this->attributes,attributes);
  Memory::WriteBarrierPtr<unsigned_char>::WriteBarrierSet(&this->setters,setters);
  this->setterCount = setterCount;
  return;
}

Assistant:

PathTypeHandlerWithAttr::PathTypeHandlerWithAttr(TypePath *typePath, ObjectSlotAttributes * attributes, PathTypeSetterSlotIndex * setters, PathTypeSetterSlotIndex setterCount, uint16 pathLength, const PropertyIndex slotCapacity, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots, bool isLocked, bool isShared, DynamicType* predecessorType) :
        PathTypeHandlerNoAttr(typePath, pathLength, slotCapacity, inlineSlotCapacity, offsetOfInlineSlots, isLocked, isShared, predecessorType),
        attributes(attributes),
        setters(setters),
        setterCount(setterCount)
    {
    }